

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall CaDiCaL::Solver::disconnect_learner(Solver *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FILE *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  File *file;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *in_RCX;
  Solver *pSVar18;
  CaDiCaL *file_name;
  Internal *pIVar19;
  bool antecedents;
  bool antecedents_00;
  bool antecedents_01;
  bool antecedents_02;
  Internal *this_00;
  Solver *pSVar20;
  Solver *pSVar21;
  CaDiCaL *this_01;
  undefined1 print;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  External *pEVar25;
  External *pEVar26;
  Internal *pIVar27;
  undefined1 *this_02;
  bool bVar28;
  bool bVar29;
  
  pcVar22 = "void CaDiCaL::Solver::disconnect_learner()";
  pSVar18 = this;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"void CaDiCaL::Solver::disconnect_learner()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (this->external == (External *)0x0) {
    disconnect_learner();
LAB_0085ee7d:
    disconnect_learner();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0085ee7d;
    if ((this->_state & VALID) != 0) {
      this->external->learner = (Learner *)0x0;
      return;
    }
  }
  disconnect_learner();
  pSVar20 = pSVar18;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar18,
             "void CaDiCaL::Solver::connect_fixed_listener(FixedAssignmentListener *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (pSVar18->external == (External *)0x0) {
    connect_fixed_listener();
LAB_0085eeeb:
    connect_fixed_listener();
LAB_0085eef0:
    connect_fixed_listener();
  }
  else {
    if (pSVar18->internal == (Internal *)0x0) goto LAB_0085eeeb;
    if ((pSVar18->_state & VALID) == 0) goto LAB_0085eef0;
    if ((FixedAssignmentListener *)pcVar22 != (FixedAssignmentListener *)0x0) {
      if (pSVar18->external->fixed_listener != (FixedAssignmentListener *)0x0) {
        disconnect_fixed_listener(pSVar18);
      }
      pSVar18->external->fixed_listener = (FixedAssignmentListener *)pcVar22;
      return;
    }
  }
  connect_fixed_listener();
  pcVar22 = "void CaDiCaL::Solver::disconnect_fixed_listener()";
  pSVar18 = pSVar20;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar20,"void CaDiCaL::Solver::disconnect_fixed_listener()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (pSVar20->external == (External *)0x0) {
    disconnect_fixed_listener();
LAB_0085ef39:
    disconnect_fixed_listener();
  }
  else {
    if (pSVar20->internal == (Internal *)0x0) goto LAB_0085ef39;
    if ((pSVar20->_state & VALID) != 0) {
      pSVar20->external->fixed_listener = (FixedAssignmentListener *)0x0;
      return;
    }
  }
  disconnect_fixed_listener();
  pSVar20 = pSVar18;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar18,
             "void CaDiCaL::Solver::connect_external_propagator(ExternalPropagator *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (pSVar18->external == (External *)0x0) {
    connect_external_propagator();
LAB_0085efbe:
    connect_external_propagator();
LAB_0085efc3:
    connect_external_propagator();
  }
  else {
    if (pSVar18->internal == (Internal *)0x0) goto LAB_0085efbe;
    if ((pSVar18->_state & VALID) == 0) goto LAB_0085efc3;
    if ((ExternalPropagator *)pcVar22 != (ExternalPropagator *)0x0) {
      if (pSVar18->external->propagator != (ExternalPropagator *)0x0) {
        disconnect_external_propagator(pSVar18);
      }
      pSVar18->external->propagator = (ExternalPropagator *)pcVar22;
      Internal::connect_propagator(pSVar18->internal);
      pIVar19 = pSVar18->internal;
      pIVar19->external_prop = true;
      pIVar19->external_prop_is_lazy = (bool)((ExternalPropagator *)pcVar22)[8];
      return;
    }
  }
  connect_external_propagator();
  pcVar22 = "void CaDiCaL::Solver::disconnect_external_propagator()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar20,"void CaDiCaL::Solver::disconnect_external_propagator()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  pEVar25 = pSVar20->external;
  if (pEVar25 == (External *)0x0) {
    disconnect_external_propagator();
LAB_0085f035:
    disconnect_external_propagator();
  }
  else {
    if (pSVar20->internal == (Internal *)0x0) goto LAB_0085f035;
    if ((pSVar20->_state & VALID) != 0) {
      if (pEVar25->propagator != (ExternalPropagator *)0x0) {
        External::reset_observed_vars(pEVar25);
      }
      pSVar20->external->propagator = (ExternalPropagator *)0x0;
      Internal::set_tainted_literal(pSVar20->internal);
      pIVar19 = pSVar20->internal;
      pIVar19->external_prop = false;
      pIVar19->external_prop_is_lazy = true;
      return;
    }
  }
  disconnect_external_propagator();
  pSVar20 = (Solver *)((ulong)pcVar22 & 0xffffffff);
  bVar28 = *(long *)&pEVar25->max_var == 0;
  pFVar4 = *(FILE **)&(pEVar25->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pSVar18 = (Solver *)CONCAT71((int7)((ulong)in_RCX >> 8),pFVar4 == (FILE *)0x0 || bVar28);
  if (pFVar4 != (FILE *)0x0 && !bVar28) {
    pSVar18 = pSVar20;
    fprintf(pFVar4,"%s %d\n","observe");
    fflush(*(FILE **)&(pEVar25->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar23 = "void CaDiCaL::Solver::add_observed_var(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar25,"void CaDiCaL::Solver::add_observed_var(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar18->adding_clause);
  if ((External *)pEVar25->vsize == (External *)0x0) {
    add_observed_var();
LAB_0085f0c7:
    add_observed_var();
LAB_0085f0cc:
    add_observed_var();
  }
  else {
    if (*(long *)&pEVar25->max_var == 0) goto LAB_0085f0c7;
    if (((ulong)pEVar25->internal & 0x7e00000000) == 0) goto LAB_0085f0cc;
    if (((ulong)pcVar22 & 0x7fffffff) != 0) {
      External::add_observed_var((External *)pEVar25->vsize,(int)pcVar22);
      return;
    }
  }
  add_observed_var(pSVar20);
  pSVar21 = (Solver *)((ulong)pcVar23 & 0xffffffff);
  bVar28 = pSVar20->internal == (Internal *)0x0;
  pFVar4 = (FILE *)pSVar20->trace_api_file;
  pSVar18 = (Solver *)CONCAT71((int7)((ulong)pSVar18 >> 8),pFVar4 == (FILE *)0x0 || bVar28);
  if (pFVar4 != (FILE *)0x0 && !bVar28) {
    pSVar18 = pSVar21;
    fprintf(pFVar4,"%s %d\n","unobserve");
    fflush((FILE *)pSVar20->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar20,"void CaDiCaL::Solver::remove_observed_var(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar18->adding_clause);
  if (pSVar20->external == (External *)0x0) {
    remove_observed_var();
LAB_0085f15f:
    remove_observed_var();
LAB_0085f164:
    remove_observed_var();
  }
  else {
    if (pSVar20->internal == (Internal *)0x0) goto LAB_0085f15f;
    if ((pSVar20->_state & VALID) == 0) goto LAB_0085f164;
    if (((ulong)pcVar23 & 0x7fffffff) != 0) {
      External::remove_observed_var(pSVar20->external,(int)pcVar23);
      return;
    }
  }
  remove_observed_var(pSVar21);
  bVar28 = pSVar21->internal == (Internal *)0x0;
  pFVar4 = (FILE *)pSVar21->trace_api_file;
  pcVar22 = (char *)CONCAT71((int7)((ulong)pSVar18 >> 8),pFVar4 == (FILE *)0x0 || bVar28);
  if (pFVar4 != (FILE *)0x0 && !bVar28) {
    fprintf(pFVar4,"%s\n","reset_observed_vars");
    fflush((FILE *)pSVar21->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar21,"void CaDiCaL::Solver::reset_observed_vars()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  pEVar25 = pSVar21->external;
  if (pEVar25 == (External *)0x0) {
    reset_observed_vars();
LAB_0085f1df:
    reset_observed_vars();
  }
  else {
    if (pSVar21->internal == (Internal *)0x0) goto LAB_0085f1df;
    if ((pSVar21->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) != 0) {
      External::reset_observed_vars(pEVar25);
      return;
    }
  }
  reset_observed_vars();
  bVar28 = *(long *)&pEVar25->max_var == 0;
  pFVar4 = *(FILE **)&(pEVar25->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar22 = (char *)CONCAT71((int7)((ulong)pcVar22 >> 8),pFVar4 == (FILE *)0x0 || bVar28);
  if (pFVar4 != (FILE *)0x0 && !bVar28) {
    fprintf(pFVar4,"%s\n","active");
    fflush(*(FILE **)&(pEVar25->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar26 = pEVar25;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar25,"int CaDiCaL::Solver::active() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  if (pEVar25->vsize == 0) {
    active();
LAB_0085f25b:
    active();
  }
  else {
    if (*(long *)&pEVar25->max_var == 0) goto LAB_0085f25b;
    if (((ulong)pEVar25->internal & 0x6e00000000) != 0) {
      return;
    }
  }
  active();
  bVar28 = *(long *)&pEVar26->max_var == 0;
  pFVar4 = *(FILE **)&(pEVar26->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar22 = (char *)CONCAT71((int7)((ulong)pcVar22 >> 8),pFVar4 == (FILE *)0x0 || bVar28);
  if (pFVar4 != (FILE *)0x0 && !bVar28) {
    fprintf(pFVar4,"%s\n","redundant");
    fflush(*(FILE **)&(pEVar26->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pEVar25 = pEVar26;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar26,"int64_t CaDiCaL::Solver::redundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  if (pEVar26->vsize == 0) {
    redundant();
LAB_0085f2d8:
    redundant();
  }
  else {
    if (*(long *)&pEVar26->max_var == 0) goto LAB_0085f2d8;
    if (((ulong)pEVar26->internal & 0x6e00000000) != 0) {
      return;
    }
  }
  redundant();
  bVar28 = *(long *)&pEVar25->max_var == 0;
  pFVar4 = *(FILE **)&(pEVar25->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pcVar22 = (char *)CONCAT71((int7)((ulong)pcVar22 >> 8),pFVar4 == (FILE *)0x0 || bVar28);
  if (pFVar4 != (FILE *)0x0 && !bVar28) {
    fprintf(pFVar4,"%s\n","irredundant");
    fflush(*(FILE **)&(pEVar25->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar23 = "int64_t CaDiCaL::Solver::irredundant() const";
  pEVar26 = pEVar25;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar25,"int64_t CaDiCaL::Solver::irredundant() const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  if (pEVar25->vsize == 0) {
    irredundant();
LAB_0085f354:
    irredundant();
  }
  else {
    if (*(long *)&pEVar25->max_var == 0) goto LAB_0085f354;
    if (((ulong)pEVar25->internal & 0x6e00000000) != 0) {
      return;
    }
  }
  irredundant();
  pSVar20 = (Solver *)((ulong)pcVar23 & 0xffffffff);
  bVar28 = *(long *)&pEVar26->max_var == 0;
  pFVar4 = *(FILE **)&(pEVar26->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  pSVar18 = (Solver *)CONCAT71((int7)((ulong)pcVar22 >> 8),pFVar4 == (FILE *)0x0 || bVar28);
  if (pFVar4 != (FILE *)0x0 && !bVar28) {
    pSVar18 = pSVar20;
    fprintf(pFVar4,"%s %d\n","freeze");
    fflush(*(FILE **)&(pEVar26->vals).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  }
  pcVar22 = "void CaDiCaL::Solver::freeze(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pEVar26,"void CaDiCaL::Solver::freeze(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar18->adding_clause);
  if ((External *)pEVar26->vsize == (External *)0x0) {
    freeze();
LAB_0085f3e5:
    freeze();
LAB_0085f3ea:
    freeze();
  }
  else {
    if (*(long *)&pEVar26->max_var == 0) goto LAB_0085f3e5;
    if (((ulong)pEVar26->internal & 0x6e00000000) == 0) goto LAB_0085f3ea;
    if (((ulong)pcVar23 & 0x7fffffff) != 0) {
      External::freeze((External *)pEVar26->vsize,(int)pcVar23);
      return;
    }
  }
  freeze(pSVar20);
  pSVar21 = (Solver *)((ulong)pcVar22 & 0xffffffff);
  bVar28 = pSVar20->internal == (Internal *)0x0;
  pFVar4 = (FILE *)pSVar20->trace_api_file;
  pSVar18 = (Solver *)CONCAT71((int7)((ulong)pSVar18 >> 8),pFVar4 == (FILE *)0x0 || bVar28);
  if (pFVar4 != (FILE *)0x0 && !bVar28) {
    pSVar18 = pSVar21;
    fprintf(pFVar4,"%s %d\n","melt");
    fflush((FILE *)pSVar20->trace_api_file);
  }
  pcVar23 = "void CaDiCaL::Solver::melt(int)";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar20,"void CaDiCaL::Solver::melt(int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar18->adding_clause);
  pEVar25 = pSVar20->external;
  if (pEVar25 == (External *)0x0) {
LAB_0085f4ac:
    melt();
LAB_0085f4b1:
    melt();
LAB_0085f4b6:
    melt();
  }
  else {
    if (pSVar20->internal == (Internal *)0x0) goto LAB_0085f4b1;
    if ((pSVar20->_state & VALID) == 0) goto LAB_0085f4b6;
    if (((ulong)pcVar22 & 0x7fffffff) != 0) {
      uVar16 = (uint)pcVar22;
      uVar17 = -uVar16;
      if (0 < (int)uVar16) {
        uVar17 = uVar16;
      }
      if ((((int)uVar17 <= pEVar25->max_var) &&
          (pSVar18 = (Solver *)
                     (pEVar25->frozentab).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
          (int)uVar17 <
          (int)((ulong)((long)(pEVar25->frozentab).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pSVar18) >> 2))) &&
         (*(int *)(&pSVar18->adding_clause + (ulong)uVar17 * 4) != 0)) {
        External::melt(pEVar25,uVar16);
        return;
      }
      melt(pSVar21);
      goto LAB_0085f4ac;
    }
  }
  melt(pSVar21);
  this_01 = (CaDiCaL *)((ulong)pcVar23 & 0xffffffff);
  bVar28 = pSVar21->internal == (Internal *)0x0;
  pFVar4 = (FILE *)pSVar21->trace_api_file;
  file_name = (CaDiCaL *)CONCAT71((int7)((ulong)pSVar18 >> 8),pFVar4 == (FILE *)0x0 || bVar28);
  if (pFVar4 != (FILE *)0x0 && !bVar28) {
    file_name = this_01;
    fprintf(pFVar4,"%s %d\n","frozen");
    fflush((FILE *)pSVar21->trace_api_file);
  }
  pcVar22 = "bool CaDiCaL::Solver::frozen(int) const";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pSVar21,"bool CaDiCaL::Solver::frozen(int) const",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)file_name);
  if (pSVar21->external == (External *)0x0) {
    frozen();
LAB_0085f575:
    frozen();
LAB_0085f57a:
    frozen();
  }
  else {
    if (pSVar21->internal == (Internal *)0x0) goto LAB_0085f575;
    if ((pSVar21->_state & VALID) == 0) goto LAB_0085f57a;
    if (((ulong)pcVar23 & 0x7fffffff) != 0) {
      return;
    }
  }
  frozen();
  pFVar4 = *(FILE **)(this_01 + 0x20);
  pIVar19 = (Internal *)
            CONCAT71((int7)((ulong)file_name >> 8),
                     pFVar4 == (FILE *)0x0 || *(long *)(this_01 + 8) == 0);
  if (pFVar4 != (FILE *)0x0 && *(long *)(this_01 + 8) != 0) {
    pIVar19 = this_00;
    fprintf(pFVar4,"%s %s\n","trace_proof");
    fflush(*(FILE **)(this_01 + 0x20));
  }
  print = 0x10;
  require_solver_pointer_to_be_non_zero
            (this_01,"bool CaDiCaL::Solver::trace_proof(FILE *, const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,(char *)pIVar19);
  if (*(long *)(this_01 + 0x10) == 0) {
    trace_proof();
LAB_0085f622:
    trace_proof();
LAB_0085f627:
    trace_proof();
  }
  else {
    if (*(long *)(this_01 + 8) == 0) goto LAB_0085f622;
    if ((*(uint *)(this_01 + 4) & 0x6e) == 0) goto LAB_0085f627;
    if (*(uint *)(this_01 + 4) == 2) {
      file = (File *)File::write((int)*(long *)(this_01 + 8),pcVar22,(size_t)this_00);
      Internal::trace(*(Internal **)(this_01 + 8),file);
      return;
    }
  }
  pIVar27 = this_00;
  trace_proof((Solver *)this_00);
  lVar6._0_1_ = pIVar27->preprocessing;
  lVar6._1_1_ = pIVar27->protected_reasons;
  lVar6._2_1_ = pIVar27->force_saved_phase;
  lVar6._3_1_ = pIVar27->searching_lucky_phases;
  lVar6._4_1_ = pIVar27->stable;
  lVar6._5_1_ = pIVar27->reported;
  lVar6._6_1_ = pIVar27->external_prop;
  lVar6._7_1_ = pIVar27->did_external_prop;
  pFVar4 = (FILE *)(pIVar27->reluctant).v;
  pcVar22 = (char *)CONCAT71((int7)((ulong)pIVar19 >> 8),pFVar4 == (FILE *)0x0 || lVar6 == 0);
  if (pFVar4 != (FILE *)0x0 && lVar6 != 0) {
    fprintf(pFVar4,"%s\n","close_proof_trace");
    fflush((FILE *)(pIVar27->reluctant).v);
  }
  pcVar23 = "void CaDiCaL::Solver::close_proof_trace(bool)";
  pIVar19 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,"void CaDiCaL::Solver::close_proof_trace(bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  lVar5._0_1_ = pIVar27->external_prop_is_lazy;
  lVar5._1_1_ = pIVar27->forced_backt_allowed;
  lVar5._2_1_ = pIVar27->private_steps;
  lVar5._3_1_ = pIVar27->rephased;
  lVar5._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
  if (lVar5 == 0) {
    close_proof_trace();
LAB_0085f6d7:
    close_proof_trace();
LAB_0085f6dc:
    close_proof_trace();
LAB_0085f6e1:
    close_proof_trace();
  }
  else {
    lVar6 = *(long *)&pIVar27->preprocessing;
    if (lVar6 == 0) goto LAB_0085f6d7;
    if ((pIVar27->unsat & 0x6eU) == 0) goto LAB_0085f6dc;
    pcVar22 = *(char **)(lVar6 + 0xc50);
    if (*(char **)(lVar6 + 0xc48) == pcVar22) goto LAB_0085f6e1;
    pIVar19 = *(Internal **)(pcVar22 + -8);
    cVar15 = (**(code **)(*(long *)pIVar19 + 0x98))();
    if (cVar15 == '\0') {
      Internal::close_trace(*(Internal **)&pIVar27->preprocessing,(bool)print);
      return;
    }
  }
  close_proof_trace();
  bVar28 = SUB81(pcVar22,0);
  pcVar24 = "void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)";
  pIVar27 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,"void CaDiCaL::Solver::connect_proof_tracer(Tracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  lVar7._0_1_ = pIVar19->external_prop_is_lazy;
  lVar7._1_1_ = pIVar19->forced_backt_allowed;
  lVar7._2_1_ = pIVar19->private_steps;
  lVar7._3_1_ = pIVar19->rephased;
  lVar7._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar7 == 0) {
    connect_proof_tracer();
LAB_0085f752:
    connect_proof_tracer();
LAB_0085f757:
    connect_proof_tracer();
LAB_0085f75c:
    connect_proof_tracer();
  }
  else {
    pIVar27 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar27 == (Internal *)0x0) goto LAB_0085f752;
    uVar17._0_1_ = pIVar19->unsat;
    uVar17._1_1_ = pIVar19->iterating;
    uVar17._2_1_ = pIVar19->localsearching;
    uVar17._3_1_ = pIVar19->lookingahead;
    if ((uVar17 & 0x6e) == 0) goto LAB_0085f757;
    if (uVar17 != 2) goto LAB_0085f75c;
    if ((Tracer *)pcVar23 != (Tracer *)0x0) {
      Internal::connect_proof_tracer(pIVar27,(Tracer *)pcVar23,antecedents,bVar28);
      return;
    }
  }
  connect_proof_tracer();
  bVar28 = SUB81(pcVar22,0);
  pcVar23 = "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)";
  pIVar19 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,
             "void CaDiCaL::Solver::connect_proof_tracer(InternalTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  lVar8._0_1_ = pIVar27->external_prop_is_lazy;
  lVar8._1_1_ = pIVar27->forced_backt_allowed;
  lVar8._2_1_ = pIVar27->private_steps;
  lVar8._3_1_ = pIVar27->rephased;
  lVar8._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
  if (lVar8 == 0) {
    connect_proof_tracer();
LAB_0085f7cc:
    connect_proof_tracer();
LAB_0085f7d1:
    connect_proof_tracer();
LAB_0085f7d6:
    connect_proof_tracer();
  }
  else {
    pIVar19 = *(Internal **)&pIVar27->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0085f7cc;
    uVar16._0_1_ = pIVar27->unsat;
    uVar16._1_1_ = pIVar27->iterating;
    uVar16._2_1_ = pIVar27->localsearching;
    uVar16._3_1_ = pIVar27->lookingahead;
    if ((uVar16 & 0x6e) == 0) goto LAB_0085f7d1;
    if (uVar16 != 2) goto LAB_0085f7d6;
    if ((InternalTracer *)pcVar24 != (InternalTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar19,(InternalTracer *)pcVar24,antecedents_00,bVar28);
      return;
    }
  }
  connect_proof_tracer();
  bVar28 = SUB81(pcVar22,0);
  pcVar24 = "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)";
  pIVar27 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,
             "void CaDiCaL::Solver::connect_proof_tracer(StatTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  lVar9._0_1_ = pIVar19->external_prop_is_lazy;
  lVar9._1_1_ = pIVar19->forced_backt_allowed;
  lVar9._2_1_ = pIVar19->private_steps;
  lVar9._3_1_ = pIVar19->rephased;
  lVar9._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar9 == 0) {
    connect_proof_tracer();
LAB_0085f846:
    connect_proof_tracer();
LAB_0085f84b:
    connect_proof_tracer();
LAB_0085f850:
    connect_proof_tracer();
  }
  else {
    pIVar27 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar27 == (Internal *)0x0) goto LAB_0085f846;
    uVar1._0_1_ = pIVar19->unsat;
    uVar1._1_1_ = pIVar19->iterating;
    uVar1._2_1_ = pIVar19->localsearching;
    uVar1._3_1_ = pIVar19->lookingahead;
    if ((uVar1 & 0x6e) == 0) goto LAB_0085f84b;
    if (uVar1 != 2) goto LAB_0085f850;
    if ((StatTracer *)pcVar23 != (StatTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar27,(StatTracer *)pcVar23,antecedents_01,bVar28);
      return;
    }
  }
  connect_proof_tracer();
  bVar28 = SUB81(pcVar22,0);
  pcVar23 = "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)";
  pIVar19 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,
             "void CaDiCaL::Solver::connect_proof_tracer(FileTracer *, bool, bool)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  lVar10._0_1_ = pIVar27->external_prop_is_lazy;
  lVar10._1_1_ = pIVar27->forced_backt_allowed;
  lVar10._2_1_ = pIVar27->private_steps;
  lVar10._3_1_ = pIVar27->rephased;
  lVar10._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
  if (lVar10 == 0) {
    connect_proof_tracer();
LAB_0085f8c0:
    connect_proof_tracer();
LAB_0085f8c5:
    connect_proof_tracer();
LAB_0085f8ca:
    connect_proof_tracer();
  }
  else {
    pIVar19 = *(Internal **)&pIVar27->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0085f8c0;
    uVar2._0_1_ = pIVar27->unsat;
    uVar2._1_1_ = pIVar27->iterating;
    uVar2._2_1_ = pIVar27->localsearching;
    uVar2._3_1_ = pIVar27->lookingahead;
    if ((uVar2 & 0x6e) == 0) goto LAB_0085f8c5;
    if (uVar2 != 2) goto LAB_0085f8ca;
    if ((FileTracer *)pcVar24 != (FileTracer *)0x0) {
      Internal::connect_proof_tracer(pIVar19,(FileTracer *)pcVar24,antecedents_02,bVar28);
      return;
    }
  }
  connect_proof_tracer();
  pcVar24 = "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)";
  pIVar27 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,"bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  lVar11._0_1_ = pIVar19->external_prop_is_lazy;
  lVar11._1_1_ = pIVar19->forced_backt_allowed;
  lVar11._2_1_ = pIVar19->private_steps;
  lVar11._3_1_ = pIVar19->rephased;
  lVar11._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar11 == 0) {
    disconnect_proof_tracer();
LAB_0085f921:
    disconnect_proof_tracer();
LAB_0085f926:
    disconnect_proof_tracer();
  }
  else {
    pIVar27 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar27 == (Internal *)0x0) goto LAB_0085f921;
    if ((pIVar19->unsat & 0x6eU) == 0) goto LAB_0085f926;
    if ((Tracer *)pcVar23 != (Tracer *)0x0) {
      Internal::disconnect_proof_tracer(pIVar27,(Tracer *)pcVar23);
      return;
    }
  }
  disconnect_proof_tracer();
  pcVar23 = "bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)";
  pIVar19 = pIVar27;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,"bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  lVar12._0_1_ = pIVar27->external_prop_is_lazy;
  lVar12._1_1_ = pIVar27->forced_backt_allowed;
  lVar12._2_1_ = pIVar27->private_steps;
  lVar12._3_1_ = pIVar27->rephased;
  lVar12._4_4_ = *(undefined4 *)&pIVar27->field_0x14;
  if (lVar12 == 0) {
    disconnect_proof_tracer();
LAB_0085f97d:
    disconnect_proof_tracer();
LAB_0085f982:
    disconnect_proof_tracer();
  }
  else {
    pIVar19 = *(Internal **)&pIVar27->preprocessing;
    if (pIVar19 == (Internal *)0x0) goto LAB_0085f97d;
    if ((pIVar27->unsat & 0x6eU) == 0) goto LAB_0085f982;
    if ((StatTracer *)pcVar24 != (StatTracer *)0x0) {
      Internal::disconnect_proof_tracer(pIVar19,(StatTracer *)pcVar24);
      return;
    }
  }
  disconnect_proof_tracer();
  pIVar27 = pIVar19;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar19,"bool CaDiCaL::Solver::disconnect_proof_tracer(FileTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  lVar13._0_1_ = pIVar19->external_prop_is_lazy;
  lVar13._1_1_ = pIVar19->forced_backt_allowed;
  lVar13._2_1_ = pIVar19->private_steps;
  lVar13._3_1_ = pIVar19->rephased;
  lVar13._4_4_ = *(undefined4 *)&pIVar19->field_0x14;
  if (lVar13 == 0) {
    disconnect_proof_tracer();
LAB_0085f9d9:
    disconnect_proof_tracer();
LAB_0085f9de:
    disconnect_proof_tracer();
  }
  else {
    pIVar27 = *(Internal **)&pIVar19->preprocessing;
    if (pIVar27 == (Internal *)0x0) goto LAB_0085f9d9;
    if ((pIVar19->unsat & 0x6eU) == 0) goto LAB_0085f9de;
    if ((FileTracer *)pcVar23 != (FileTracer *)0x0) {
      Internal::disconnect_proof_tracer(pIVar27,(FileTracer *)pcVar23);
      return;
    }
  }
  disconnect_proof_tracer();
  lVar14._0_1_ = pIVar27->preprocessing;
  lVar14._1_1_ = pIVar27->protected_reasons;
  lVar14._2_1_ = pIVar27->force_saved_phase;
  lVar14._3_1_ = pIVar27->searching_lucky_phases;
  lVar14._4_1_ = pIVar27->stable;
  lVar14._5_1_ = pIVar27->reported;
  lVar14._6_1_ = pIVar27->external_prop;
  lVar14._7_1_ = pIVar27->did_external_prop;
  pFVar4 = (FILE *)(pIVar27->reluctant).v;
  pcVar22 = (char *)CONCAT71((int7)((ulong)pcVar22 >> 8),pFVar4 == (FILE *)0x0 || lVar14 == 0);
  if (pFVar4 != (FILE *)0x0 && lVar14 != 0) {
    fprintf(pFVar4,"%s\n","conclude");
    fflush((FILE *)(pIVar27->reluctant).v);
  }
  pcVar23 = "void CaDiCaL::Solver::conclude()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar27,"void CaDiCaL::Solver::conclude()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar22);
  pEVar25 = *(External **)&pIVar27->external_prop_is_lazy;
  if (pEVar25 == (External *)0x0) {
    conclude();
LAB_0085fa79:
    conclude();
  }
  else {
    if (*(Internal **)&pIVar27->preprocessing == (Internal *)0x0) goto LAB_0085fa79;
    uVar3._0_1_ = pIVar27->unsat;
    uVar3._1_1_ = pIVar27->iterating;
    uVar3._2_1_ = pIVar27->localsearching;
    uVar3._3_1_ = pIVar27->lookingahead;
    if ((uVar3 & 0x6e) != 0) {
      if (uVar3 == 4) {
        External::conclude_unknown(pEVar25);
        return;
      }
      if (uVar3 == 0x20) {
        External::conclude_sat(pEVar25);
        return;
      }
      if (uVar3 == 0x40) {
        Internal::conclude_unsat(*(Internal **)&pIVar27->preprocessing);
        return;
      }
      goto LAB_0085fa83;
    }
  }
  conclude();
LAB_0085fa83:
  conclude();
  bVar28 = _stderr != pEVar25;
  if (bVar28) {
    this_02 = (undefined1 *)0x0;
  }
  else {
    this_02 = terr;
  }
  bVar29 = _stdout == pEVar25;
  if (bVar29) {
    this_02 = tout;
  }
  pcVar22 = CaDiCaL::version();
  pcVar24 = identifier();
  __s = compiler();
  __s_00 = date();
  __s_01 = flags();
  fputs(pcVar23,(FILE *)pEVar25);
  if (bVar29 || !bVar28) {
    Terminal::color((Terminal *)this_02,0x23,false);
    fputs("Version ",(FILE *)pEVar25);
    Terminal::code((Terminal *)this_02,"0m");
  }
  else {
    fputs("Version ",(FILE *)pEVar25);
  }
  fputs(pcVar22,(FILE *)pEVar25);
  if (pcVar24 != (char *)0x0) {
    if (bVar29 || !bVar28) {
      Terminal::color((Terminal *)this_02,0x23,false);
      fputc(0x20,(FILE *)pEVar25);
      fputs(pcVar24,(FILE *)pEVar25);
      Terminal::code((Terminal *)this_02,"0m");
    }
    else {
      fputc(0x20,(FILE *)pEVar25);
      fputs(pcVar24,(FILE *)pEVar25);
    }
  }
  fputc(10,(FILE *)pEVar25);
  if (__s != (char *)0x0) {
    fputs(pcVar23,(FILE *)pEVar25);
    if (bVar29 || !bVar28) {
      Terminal::color((Terminal *)this_02,0x23,false);
    }
    fputs(__s,(FILE *)pEVar25);
    if (__s_01 != (char *)0x0) {
      fputc(0x20,(FILE *)pEVar25);
      fputs(__s_01,(FILE *)pEVar25);
    }
    if (bVar29 || !bVar28) {
      Terminal::code((Terminal *)this_02,"0m");
    }
    fputc(10,(FILE *)pEVar25);
  }
  if (__s_00 != (char *)0x0) {
    fputs(pcVar23,(FILE *)pEVar25);
    if (bVar29 || !bVar28) {
      Terminal::color((Terminal *)this_02,0x23,false);
      fputs(__s_00,(FILE *)pEVar25);
      Terminal::code((Terminal *)this_02,"0m");
    }
    else {
      fputs(__s_00,(FILE *)pEVar25);
    }
    fputc(10,(FILE *)pEVar25);
  }
  fflush((FILE *)pEVar25);
  return;
}

Assistant:

void Solver::disconnect_learner () {
  LOG_API_CALL_BEGIN ("disconnect_learner");
  REQUIRE_VALID_STATE ();
#ifdef LOGGING
  if (external->learner)
    LOG ("disconnecting previous learner");
  else
    LOG ("ignoring to disconnect learner (no previous one)");
#endif
  external->learner = 0;
  LOG_API_CALL_END ("disconnect_learner");
}